

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

log_map_iterator log_map_iterator_begin(log_map map)

{
  int iVar1;
  log_map in_RDI;
  log_map_iterator iterator;
  log_map_iterator local_8;
  
  if (in_RDI == (log_map)0x0) {
    local_8 = (log_map_iterator)0x0;
  }
  else {
    local_8 = (log_map_iterator)malloc(0x20);
    if (local_8 == (log_map_iterator)0x0) {
      local_8 = (log_map_iterator)0x0;
    }
    else {
      local_8->map = in_RDI;
      local_8->position = 0;
      local_8->bucket = (log_map_bucket_conflict)0x0;
      local_8->next = (local_8->map->table).data + local_8->position;
      iVar1 = log_map_iterator_next(local_8);
      if (iVar1 != 0) {
        free(local_8);
        local_8 = (log_map_iterator)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

log_map_iterator log_map_iterator_begin(log_map map)
{
	log_map_iterator iterator = NULL;

	if (map == NULL)
	{
		return NULL;
	}

	iterator = malloc(sizeof(struct log_map_iterator_type));

	if (iterator == NULL)
	{
		return NULL;
	}

	iterator->map = map;
	iterator->position = 0;
	iterator->bucket = NULL;
	iterator->next = &iterator->map->table.data[iterator->position];

	if (log_map_iterator_next(iterator) != 0)
	{
		free(iterator);

		return NULL;
	}

	return iterator;
}